

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher_dirk.c
# Opt level: O2

ARKodeButcherTable ARKodeButcherTable_LoadDIRK(ARKODE_DIRKTableID imethod)

{
  sunrealtype *psVar1;
  double dVar2;
  sunrealtype *psVar3;
  ARKodeButcherTable pAVar4;
  sunrealtype sVar5;
  sunrealtype *psVar6;
  double *pdVar7;
  sunrealtype **ppsVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  
  switch(imethod) {
  case ARKODE_MIN_DIRK_NUM:
    pAVar4 = ARKodeButcherTable_Alloc(2,1);
    pAVar4->q = 2;
    pAVar4->p = 1;
    ppsVar8 = pAVar4->A;
    **ppsVar8 = 1.0;
    psVar3 = ppsVar8[1];
    *psVar3 = -1.0;
    psVar3[1] = 1.0;
    psVar3 = pAVar4->b;
    *psVar3 = 0.5;
    psVar3[1] = 0.5;
    *pAVar4->d = 1.0;
    psVar3 = pAVar4->c;
    *psVar3 = 1.0;
    psVar3[1] = 0.0;
    break;
  case ARKODE_BILLINGTON_3_3_2:
    pAVar4 = ARKodeButcherTable_Alloc(3,1);
    pAVar4->q = 2;
    pAVar4->p = 3;
    ppsVar8 = pAVar4->A;
    **ppsVar8 = 0.2928932188134525;
    psVar3 = ppsVar8[1];
    *psVar3 = 0.7989898732233307;
    psVar3[1] = 0.2928932188134525;
    psVar3 = ppsVar8[2];
    *psVar3 = 0.7407892288408794;
    psVar3[1] = 0.25921077115912056;
    psVar3[2] = 0.2928932188134525;
    psVar3 = pAVar4->d;
    *psVar3 = 0.6916651159922363;
    psVar3[1] = 0.5035970298833986;
    psVar3[2] = -0.19526214587563498;
    psVar3 = pAVar4->b;
    *psVar3 = 0.7407892288408794;
    psVar3[1] = 0.25921077115912056;
    psVar3 = pAVar4->c;
    *psVar3 = 0.2928932188134525;
    psVar3[1] = 1.0918830920367832;
    psVar3[2] = 1.2928932188134525;
    break;
  case ARKODE_TRBDF2_3_3_2:
    pAVar4 = ARKodeButcherTable_Alloc(3,1);
    pAVar4->q = 2;
    pAVar4->p = 3;
    ppsVar8 = pAVar4->A;
    psVar3 = ppsVar8[1];
    *psVar3 = 0.2928932188134524;
    psVar3[1] = 0.2928932188134524;
    psVar3 = ppsVar8[2];
    *psVar3 = 0.3535533905932738;
    psVar3[1] = 0.3535533905932738;
    sVar5 = 0.2928932188134524;
    psVar3[2] = 0.2928932188134524;
    psVar3 = pAVar4->d;
    *psVar3 = 0.21548220313557542;
    psVar3[1] = 0.6868867239266071;
    psVar3[2] = 0.09763107293781748;
    psVar3 = pAVar4->b;
    *psVar3 = 0.3535533905932738;
    psVar3[1] = 0.3535533905932738;
    goto LAB_0012aa76;
  case ARKODE_KVAERNO_4_2_3:
    pAVar4 = ARKodeButcherTable_Alloc(4,1);
    pAVar4->q = 3;
    pAVar4->p = 2;
    ppsVar8 = pAVar4->A;
    psVar3 = ppsVar8[1];
    *psVar3 = 0.435866521508459;
    psVar3[1] = 0.435866521508459;
    psVar3 = ppsVar8[2];
    *psVar3 = 0.49056338842178054;
    psVar3[1] = 0.07357009006976042;
    psVar3[2] = 0.435866521508459;
    psVar3 = ppsVar8[3];
    *psVar3 = 0.30880996997674653;
    psVar3[1] = 1.4905633884217806;
    psVar3[2] = -1.2352398799069861;
    psVar3[3] = 0.435866521508459;
    psVar3 = pAVar4->b;
    *psVar3 = 0.30880996997674653;
    psVar3[1] = 1.4905633884217806;
    psVar3[2] = -1.2352398799069861;
    psVar3[3] = 0.435866521508459;
    psVar3 = pAVar4->d;
    *psVar3 = 0.49056338842178054;
    psVar3[1] = 0.07357009006976042;
    psVar3[2] = 0.435866521508459;
    psVar3 = pAVar4->c;
    uVar13 = 0;
    uVar14 = 0x3ff00000;
    goto LAB_00129b23;
  case ARKODE_ARK324L2SA_DIRK_4_2_3:
    pAVar4 = ARKodeButcherTable_Alloc(4,1);
    pAVar4->q = 3;
    pAVar4->p = 2;
    ppsVar8 = pAVar4->A;
    psVar3 = ppsVar8[1];
    *psVar3 = 0.435866521508459;
    psVar3[1] = 0.435866521508459;
    psVar3 = ppsVar8[2];
    *psVar3 = 0.2576482460664272;
    psVar3[1] = -0.09351476757488625;
    psVar3[2] = 0.435866521508459;
    psVar3 = ppsVar8[3];
    *psVar3 = 0.18764102434672383;
    psVar3[1] = -0.595297473576955;
    psVar3[2] = 0.9717899277217721;
    psVar3[3] = 0.435866521508459;
    psVar3 = pAVar4->b;
    *psVar3 = 0.18764102434672383;
    psVar3[1] = -0.595297473576955;
    psVar3[2] = 0.9717899277217721;
    psVar3[3] = 0.435866521508459;
    psVar3 = pAVar4->d;
    *psVar3 = 0.21474028622338914;
    psVar3[1] = -0.4851622638849391;
    uVar13 = 0x60615cd5;
    uVar14 = 0x3febcc98;
    uVar15 = 0x3ac889ea;
    uVar16 = 0x3fd9b567;
    goto LAB_0012967a;
  case ARKODE_CASH_5_2_4:
    pAVar4 = ARKodeButcherTable_Alloc(5,1);
    pAVar4->q = 4;
    pAVar4->p = 2;
    ppsVar8 = pAVar4->A;
    **ppsVar8 = 0.435866521508459;
    psVar3 = ppsVar8[1];
    *psVar3 = -1.135866521508459;
    psVar3[1] = 0.435866521508459;
    psVar3 = ppsVar8[2];
    *psVar3 = 1.0854333065011879;
    psVar3[1] = -0.7212998280096468;
    psVar3[2] = 0.435866521508459;
    psVar3 = ppsVar8[3];
    *psVar3 = 0.41634950157878;
    psVar3[1] = 0.19098400417955613;
    psVar3[2] = -0.11864326546011505;
    psVar3[3] = 0.435866521508459;
    psVar3 = ppsVar8[4];
    *psVar3 = 0.8968696529704295;
    psVar3[1] = 0.018272527273968903;
    psVar3[2] = -0.08459003110197204;
    psVar3[3] = -0.2664186706508854;
    psVar3[4] = 0.435866521508459;
    psVar3 = pAVar4->b;
    *psVar3 = 0.8968696529704295;
    psVar3[1] = 0.018272527273968903;
    psVar3[2] = -0.08459003110197204;
    psVar3[3] = -0.2664186706508854;
    psVar3[4] = 0.435866521508459;
    psVar3 = pAVar4->d;
    *psVar3 = 1.0564621610700966;
    psVar3[1] = -0.05646216107009664;
    goto LAB_0012a374;
  case ARKODE_CASH_5_3_4:
    pAVar4 = ARKodeButcherTable_Alloc(5,1);
    pAVar4->q = 4;
    pAVar4->p = 3;
    ppsVar8 = pAVar4->A;
    **ppsVar8 = 0.435866521508459;
    psVar3 = ppsVar8[1];
    *psVar3 = -1.135866521508459;
    psVar3[1] = 0.435866521508459;
    psVar3 = ppsVar8[2];
    *psVar3 = 1.0854333065011879;
    psVar3[1] = -0.7212998280096468;
    psVar3[2] = 0.435866521508459;
    psVar3 = ppsVar8[3];
    *psVar3 = 0.41634950157878;
    psVar3[1] = 0.19098400417955613;
    psVar3[2] = -0.11864326546011505;
    psVar3[3] = 0.435866521508459;
    psVar3 = ppsVar8[4];
    *psVar3 = 0.8968696529704295;
    psVar3[1] = 0.018272527273968903;
    psVar3[2] = -0.08459003110197204;
    psVar3[3] = -0.2664186706508854;
    psVar3[4] = 0.435866521508459;
    psVar3 = pAVar4->b;
    *psVar3 = 0.8968696529704295;
    psVar3[1] = 0.018272527273968903;
    psVar3[2] = -0.08459003110197204;
    psVar3[3] = -0.2664186706508854;
    psVar3[4] = 0.435866521508459;
    psVar3 = pAVar4->d;
    *psVar3 = 0.7766919329157524;
    psVar3[1] = 0.02974727915032039;
    psVar3[2] = -0.026744023915640965;
    psVar3[3] = 0.22030481184956816;
LAB_0012a374:
    psVar3 = pAVar4->c;
    *psVar3 = 0.435866521508459;
    psVar3[1] = -0.7;
    uVar13 = 0x3fe99999;
    uVar14 = 0xfe82bd9;
    uVar15 = 0x3fed95f8;
LAB_0012a38a:
    *(undefined4 *)(psVar3 + 2) = 0x9999999a;
    *(undefined4 *)((long)psVar3 + 0x14) = uVar13;
    *(undefined4 *)(psVar3 + 3) = uVar14;
    *(undefined4 *)((long)psVar3 + 0x1c) = uVar15;
    psVar3[4] = 1.0;
    break;
  case ARKODE_SDIRK_5_3_4:
    pAVar4 = ARKodeButcherTable_Alloc(5,1);
    pAVar4->q = 4;
    pAVar4->p = 3;
    ppsVar8 = pAVar4->A;
    **ppsVar8 = 0.25;
    psVar3 = ppsVar8[1];
    *psVar3 = 0.5;
    psVar3[1] = 0.25;
    psVar3 = ppsVar8[2];
    *psVar3 = 0.34;
    psVar3[1] = -0.04;
    psVar3[2] = 0.25;
    psVar3 = ppsVar8[3];
    *psVar3 = 0.2727941176470588;
    psVar3[1] = -0.05036764705882353;
    psVar3[2] = 0.027573529411764705;
    psVar3[3] = 0.25;
    psVar3 = ppsVar8[4];
    *psVar3 = 1.0416666666666667;
    psVar3[1] = -1.0208333333333333;
    psVar3[2] = 7.8125;
    psVar3[3] = -7.083333333333333;
    psVar3[4] = 0.25;
    psVar3 = pAVar4->b;
    *psVar3 = 1.0416666666666667;
    psVar3[1] = -1.0208333333333333;
    psVar3[2] = 7.8125;
    psVar3[3] = -7.083333333333333;
    psVar3[4] = 0.25;
    psVar3 = pAVar4->d;
    *psVar3 = 1.2291666666666667;
    psVar3[1] = -0.17708333333333334;
    psVar3[2] = 7.03125;
    psVar3[3] = -7.083333333333333;
    psVar3 = pAVar4->c;
    *psVar3 = 0.25;
    psVar3[1] = 0.75;
    uVar13 = 0x3fe19999;
    uVar14 = 0;
    uVar15 = 0x3fe00000;
    goto LAB_0012a38a;
  case ARKODE_KVAERNO_5_3_4:
    pAVar4 = ARKodeButcherTable_Alloc(5,1);
    pAVar4->q = 4;
    pAVar4->p = 3;
    ppsVar8 = pAVar4->A;
    psVar3 = ppsVar8[1];
    *psVar3 = 0.435866521508459;
    psVar3[1] = 0.435866521508459;
    psVar3 = ppsVar8[2];
    *psVar3 = 0.1407377747247062;
    psVar3[1] = -0.1083655513813208;
    psVar3[2] = 0.435866521508459;
    psVar3 = ppsVar8[3];
    *psVar3 = 0.102399400619911;
    psVar3[1] = -0.3768784522555561;
    psVar3[2] = 0.8386125301271861;
    psVar3[3] = 0.435866521508459;
    psVar3 = ppsVar8[4];
    *psVar3 = 0.15702489786032495;
    psVar3[1] = 0.11733044137043885;
    psVar3[2] = 0.6166780303921214;
    psVar3[3] = -0.32689989113134427;
    psVar3[4] = 0.435866521508459;
    psVar3 = pAVar4->b;
    *psVar3 = 0.15702489786032495;
    psVar3[1] = 0.11733044137043885;
    psVar3[2] = 0.6166780303921214;
    psVar3[3] = -0.32689989113134427;
    psVar3[4] = 0.435866521508459;
    psVar3 = pAVar4->d;
    *psVar3 = 0.102399400619911;
    psVar3[1] = -0.3768784522555561;
    psVar3[2] = 0.8386125301271861;
    psVar3[3] = 0.435866521508459;
    psVar3 = pAVar4->c;
    psVar3[1] = 0.871733043016918;
    psVar3[2] = 0.4682387448518444;
    psVar3[3] = 1.0;
    psVar3[4] = 1.0;
    break;
  case ARKODE_ARK436L2SA_DIRK_6_3_4:
    pAVar4 = ARKodeButcherTable_Alloc(6,1);
    pAVar4->q = 4;
    pAVar4->p = 3;
    ppsVar8 = pAVar4->A;
    psVar3 = ppsVar8[1];
    *psVar3 = 0.25;
    psVar3[1] = 0.25;
    psVar3 = ppsVar8[2];
    *psVar3 = 0.137776;
    psVar3[1] = -0.055776;
    psVar3[2] = 0.25;
    psVar3 = ppsVar8[3];
    *psVar3 = 0.14463686602698217;
    psVar3[1] = -0.22393190761334475;
    psVar3[2] = 0.4492950415863626;
    psVar3[3] = 0.25;
    psVar3 = ppsVar8[4];
    *psVar3 = 0.09825878328356477;
    psVar3[1] = -0.5915442428196704;
    psVar3[2] = 0.8101210538282996;
    psVar3[3] = 0.283164405707806;
    psVar3[4] = 0.25;
    psVar3 = ppsVar8[5];
    *psVar3 = 0.15791629516167136;
    psVar3[2] = 0.18675894052400077;
    psVar3[3] = 0.6805652953093346;
    psVar3[4] = -0.27524053099500667;
    psVar3[5] = 0.25;
    psVar3 = pAVar4->b;
    *psVar3 = 0.15791629516167136;
    psVar3[2] = 0.18675894052400077;
    psVar3[3] = 0.6805652953093346;
    psVar3[4] = -0.27524053099500667;
    psVar3[5] = 0.25;
    psVar3 = pAVar4->c;
    psVar3[1] = 0.5;
    psVar3[2] = 0.332;
    psVar3[3] = 0.62;
    psVar3[4] = 0.85;
    psVar3[5] = 1.0;
    psVar3 = pAVar4->d;
    *psVar3 = 0.15471180076321217;
    psVar3[2] = 0.18920519166068023;
    psVar3[3] = 0.7020453712289219;
    psVar3[4] = -0.3191873990635791;
    psVar3[5] = 0.27322503541076487;
    break;
  case ARKODE_KVAERNO_7_4_5:
    pAVar4 = ARKodeButcherTable_Alloc(7,1);
    pAVar4->q = 5;
    pAVar4->p = 4;
    ppsVar8 = pAVar4->A;
    psVar3 = ppsVar8[1];
    *psVar3 = 0.26;
    psVar3[1] = 0.26;
    psVar3 = ppsVar8[2];
    *psVar3 = 0.13;
    psVar3[1] = 0.8403332099679081;
    psVar3[2] = 0.26;
    psVar3 = ppsVar8[3];
    *psVar3 = 0.22371961478320507;
    psVar3[1] = 0.476755323197997;
    psVar3[2] = -0.06470895363112615;
    psVar3[3] = 0.26;
    psVar3 = ppsVar8[4];
    *psVar3 = 0.16648564323248322;
    psVar3[1] = 0.1045001884159172;
    psVar3[2] = 0.03631482272098715;
    psVar3[3] = -0.13090704451073998;
    psVar3[4] = 0.26;
    psVar3 = ppsVar8[5];
    *psVar3 = 0.13855640231268224;
    psVar3[2] = -0.04245337201752043;
    psVar3[3] = 0.02446657898003142;
    psVar3[4] = 0.6194303907248068;
    psVar3[5] = 0.26;
    psVar3 = ppsVar8[6];
    *psVar3 = 0.13659751177640292;
    psVar3[2] = -0.054969087965383766;
    psVar3[3] = -0.04118626728321047;
    psVar3[4] = 0.629933048990164;
    psVar3[5] = 0.06962479448202728;
    psVar3[6] = 0.26;
    psVar3 = pAVar4->b;
    *psVar3 = 0.13659751177640292;
    psVar3[2] = -0.054969087965383766;
    psVar3[3] = -0.04118626728321047;
    psVar3[4] = 0.629933048990164;
    psVar3[5] = 0.06962479448202728;
    psVar3[6] = 0.26;
    psVar3 = pAVar4->d;
    *psVar3 = 0.13855640231268224;
    psVar3[2] = -0.04245337201752043;
    psVar3[3] = 0.02446657898003142;
    psVar3[4] = 0.6194303907248068;
    psVar3[5] = 0.26;
    psVar3 = pAVar4->c;
    psVar3[1] = 0.52;
    psVar3[2] = 1.230333209967908;
    psVar3[3] = 0.8957659843500759;
    psVar3[4] = 0.43639360985864756;
    psVar3[5] = 1.0;
    psVar3[6] = 1.0;
    break;
  case ARKODE_ARK548L2SA_DIRK_8_4_5:
    pAVar4 = ARKodeButcherTable_Alloc(8,1);
    pAVar4->q = 5;
    pAVar4->p = 4;
    ppsVar8 = pAVar4->A;
    psVar3 = ppsVar8[1];
    *psVar3 = 0.205;
    psVar3[1] = 0.205;
    psVar3 = ppsVar8[2];
    *psVar3 = 0.1025;
    psVar3[1] = -0.047570415551619845;
    psVar3[2] = 0.205;
    psVar3 = ppsVar8[3];
    *psVar3 = 0.07389944079200692;
    psVar3[2] = -0.08074895409950329;
    psVar3[3] = 0.205;
    psVar3 = ppsVar8[4];
    *psVar3 = 0.299218118308015;
    psVar3[2] = 2.4638206661140414;
    psVar3[3] = -2.0480387844220567;
    psVar3[4] = 0.205;
    psVar3 = ppsVar8[5];
    *psVar3 = 0.14689238442881303;
    psVar3[2] = 0.11740332879881549;
    psVar3[3] = -0.221701968002454;
    psVar3[4] = -0.007593745225174481;
    psVar3[5] = 0.205;
    psVar3 = ppsVar8[6];
    *psVar3 = 0.17845729560319554;
    psVar3[2] = 1.0197467452199207;
    psVar3[3] = -0.22154535039396367;
    psVar3[4] = -0.03612491620526532;
    psVar3[5] = -0.5455337742238872;
    psVar3[6] = 0.205;
    psVar3 = ppsVar8[7];
    *psVar3 = -0.09554858675139874;
    psVar3[3] = 2.3386928037652464;
    psVar3[4] = -0.14043175608247527;
    psVar3[5] = -2.070587707956559;
    psVar3[6] = 0.7628752470251866;
    psVar3[7] = 0.205;
    psVar3 = pAVar4->b;
    *psVar3 = -0.09554858675139874;
    psVar3[3] = 2.3386928037652464;
    psVar3[4] = -0.14043175608247527;
    psVar3[5] = -2.070587707956559;
    psVar3[6] = 0.7628752470251866;
    psVar3[7] = 0.205;
    psVar3 = pAVar4->d;
    *psVar3 = -0.09957696480500873;
    psVar3[3] = 2.407162879999775;
    psVar3[4] = -0.1601481830855136;
    psVar3[5] = -2.1442365964445265;
    psVar3[6] = 0.7795656224249983;
    psVar3[7] = 0.21723324191027585;
    psVar3 = pAVar4->c;
    psVar3[1] = 0.41;
    psVar3[2] = 0.25992958444838016;
    psVar3[3] = 0.19815048669250362;
    psVar3[4] = 0.92;
    uVar13 = 0xeb851eb8;
    uVar14 = 0x3fceb851;
    uVar15 = 0x33333333;
    uVar16 = 0x3fe33333;
    goto LAB_0012a2af;
  case ARKODE_ARK437L2SA_DIRK_7_3_4:
    pAVar4 = ARKodeButcherTable_Alloc(7,1);
    pAVar4->q = 4;
    pAVar4->p = 3;
    ppsVar8 = pAVar4->A;
    psVar3 = ppsVar8[1];
    *psVar3 = 0.1235;
    psVar3[1] = 0.1235;
    psVar3 = ppsVar8[2];
    *psVar3 = 0.14907768747653863;
    psVar3[1] = 0.14907768747653863;
    psVar3[2] = 0.1235;
    psVar3 = ppsVar8[3];
    *psVar3 = 0.12483442871739439;
    psVar3[1] = 0.12483442871739439;
    psVar3[2] = -0.03816885743478878;
    psVar3[3] = 0.1235;
    psVar3 = ppsVar8[4];
    *psVar3 = -0.07303194030218091;
    psVar3[1] = -0.07303194030218091;
    psVar3[2] = -0.2434356871601467;
    psVar3[3] = 0.3409995677645085;
    psVar3[4] = 0.1235;
    psVar3 = ppsVar8[5];
    *psVar3 = -0.15296500088128806;
    psVar3[1] = -0.15296500088128806;
    psVar3[2] = 0.07220562047433587;
    psVar3[3] = 0.40430630248551713;
    psVar3[4] = 0.4059180788027232;
    psVar3[5] = 0.1235;
    psVar3 = ppsVar8[6];
    psVar3[2] = 0.5161107283174237;
    psVar3[3] = -0.1460635639385708;
    psVar3[4] = 0.23473048589019332;
    psVar3[5] = 0.27172234973095377;
    psVar3[6] = 0.1235;
    psVar3 = pAVar4->b;
    psVar3[2] = 0.5161107283174237;
    psVar3[3] = -0.1460635639385708;
    psVar3[4] = 0.23473048589019332;
    psVar3[5] = 0.27172234973095377;
    psVar3[6] = 0.1235;
    psVar3 = pAVar4->c;
    psVar3[1] = 0.247;
    psVar3[2] = 0.42165537495307726;
    psVar3[3] = 0.335;
    psVar3[4] = 0.075;
    psVar3[5] = 0.7;
    psVar3[6] = 1.0;
    psVar3 = pAVar4->d;
    psVar3[2] = 0.5175217461593482;
    psVar3[3] = -0.15173820706113939;
    psVar3[4] = 0.23672007870234135;
    psVar3[5] = 0.2754463821994498;
    psVar3[6] = 0.12205;
    break;
  case ARKODE_ARK548L2SAb_DIRK_8_4_5:
    pAVar4 = ARKodeButcherTable_Alloc(8,1);
    pAVar4->q = 5;
    pAVar4->p = 4;
    ppsVar8 = pAVar4->A;
    psVar3 = ppsVar8[1];
    *psVar3 = 0.2222222222222222;
    psVar3[1] = 0.2222222222222222;
    psVar3 = ppsVar8[2];
    *psVar3 = 0.26824595137478835;
    psVar3[1] = 0.26824595137478835;
    psVar3[2] = 0.2222222222222222;
    psVar3 = ppsVar8[3];
    *psVar3 = -0.057945592237231995;
    psVar3[1] = -0.057945592237231995;
    psVar3[2] = 0.008938396816283733;
    psVar3[3] = 0.2222222222222222;
    psVar3 = ppsVar8[4];
    *psVar3 = -0.043305287723547685;
    psVar3[1] = -0.043305287723547685;
    psVar3[2] = -0.034013891077568637;
    psVar3[3] = 0.25515937270676026;
    psVar3[4] = 0.2222222222222222;
    psVar3 = ppsVar8[5];
    *psVar3 = 0.13179599023759678;
    psVar3[1] = 0.13179599023759678;
    psVar3[2] = -0.03237672627786233;
    psVar3[3] = 0.12385474427672251;
    psVar3[4] = 0.14270777930372408;
    psVar3[5] = 0.2222222222222222;
    psVar3 = ppsVar8[6];
    *psVar3 = 0.3093228210043426;
    psVar3[1] = 0.3093228210043426;
    psVar3[2] = -0.6829199272336792;
    psVar3[3] = -0.05882275614969546;
    psVar3[4] = -0.04130861383349944;
    psVar3[5] = 0.8971834329859666;
    psVar3[6] = 0.2222222222222222;
    psVar3 = ppsVar8[7];
    psVar3[2] = 0.1736625357358126;
    psVar3[3] = 0.2547916626081235;
    psVar3[4] = 0.2419017684509479;
    psVar3[5] = 0.30740485830222825;
    psVar3[6] = -0.19998304731933453;
    psVar3[7] = 0.2222222222222222;
    psVar3 = pAVar4->b;
    psVar3[2] = 0.1736625357358126;
    psVar3[3] = 0.2547916626081235;
    psVar3[4] = 0.2419017684509479;
    psVar3[5] = 0.30740485830222825;
    psVar3[6] = -0.19998304731933453;
    psVar3[7] = 0.2222222222222222;
    psVar3 = pAVar4->d;
    psVar3[2] = 0.06272421695270713;
    psVar3[3] = 0.25523315714677963;
    psVar3[4] = 0.23902754916001318;
    psVar3[5] = 0.399079522075358;
    psVar3[6] = -0.14315725125850667;
    psVar3[7] = 0.18709280592364871;
    psVar3 = pAVar4->c;
    psVar3[1] = 0.4444444444444444;
    psVar3[2] = 0.7587141249717989;
    psVar3[3] = 0.11526943456404197;
    psVar3[4] = 0.3567571284043185;
    uVar13 = 0x70a3d70a;
    uVar14 = 0x3fe70a3d;
    uVar15 = 0x28f5c28f;
    uVar16 = 0x3fee8f5c;
LAB_0012a2af:
    *(undefined4 *)(psVar3 + 5) = uVar13;
    *(undefined4 *)((long)psVar3 + 0x2c) = uVar14;
    *(undefined4 *)(psVar3 + 6) = uVar15;
    *(undefined4 *)((long)psVar3 + 0x34) = uVar16;
    psVar3[7] = 1.0;
    break;
  case ARKODE_ESDIRK324L2SA_4_2_3:
    pAVar4 = ARKodeButcherTable_Alloc(4,1);
    pAVar4->q = 3;
    pAVar4->p = 2;
    ppsVar8 = pAVar4->A;
    psVar3 = ppsVar8[1];
    *psVar3 = 0.435866521508459;
    psVar3[1] = 0.435866521508459;
    psVar3 = ppsVar8[2];
    *psVar3 = 0.2576482460664272;
    psVar3[1] = -0.09351476757488625;
    psVar3[2] = 0.435866521508459;
    psVar3 = ppsVar8[3];
    *psVar3 = 0.18764102434672383;
    psVar3[1] = -0.595297473576955;
    psVar3[2] = 0.9717899277217721;
    psVar3[3] = 0.435866521508459;
    psVar3 = pAVar4->b;
    *psVar3 = 0.18764102434672383;
    psVar3[1] = -0.595297473576955;
    psVar3[2] = 0.9717899277217721;
    psVar3[3] = 0.435866521508459;
    psVar3 = pAVar4->d;
    *psVar3 = 0.10889661761586446;
    psVar3[1] = -0.9153258118707127;
    uVar13 = 0xfbcae572;
    uVar14 = 0x3ff45722;
    uVar15 = 0xa165dcab;
    uVar16 = 0x3fe11ffe;
LAB_0012967a:
    *(undefined4 *)(psVar3 + 2) = uVar13;
    *(undefined4 *)((long)psVar3 + 0x14) = uVar14;
    *(undefined4 *)(psVar3 + 3) = uVar15;
    *(undefined4 *)((long)psVar3 + 0x1c) = uVar16;
    psVar3 = pAVar4->c;
    uVar13 = 0x33333333;
    uVar14 = 0x3fe33333;
LAB_00129b23:
    *(undefined4 *)(psVar3 + 1) = 0xb1d33509;
    *(undefined4 *)((long)psVar3 + 0xc) = 0x3febe53c;
    *(undefined4 *)(psVar3 + 2) = uVar13;
    *(undefined4 *)((long)psVar3 + 0x14) = uVar14;
    psVar3[3] = 1.0;
    break;
  case ARKODE_ESDIRK325L2SA_5_2_3:
    pAVar4 = ARKodeButcherTable_Alloc(5,1);
    pAVar4->q = 3;
    pAVar4->p = 2;
    psVar3 = pAVar4->c;
    psVar3[1] = 0.45;
    psVar3[2] = 0.7681980515339464;
    psVar3[3] = 0.6;
    psVar3[4] = 1.0;
    psVar3 = pAVar4->b;
    *psVar3 = 0.17554550212940523;
    psVar3[1] = 0.17554550212940523;
    psVar3[2] = -0.34685820002600626;
    psVar3[3] = 0.7707671957671958;
    psVar3[4] = 0.225;
    psVar6 = pAVar4->d;
    *psVar6 = 0.18435122201605925;
    psVar6[1] = 0.18435122201605925;
    psVar6[2] = -0.278208184050987;
    psVar6[3] = 0.6968620125433237;
    psVar6[4] = 0.21264372747554489;
    ppsVar8 = pAVar4->A;
    psVar6 = ppsVar8[1];
    *psVar6 = 0.225;
    psVar6[1] = 0.225;
    psVar6 = ppsVar8[2];
    *psVar6 = 0.2715990257669732;
    psVar6[1] = 0.2715990257669732;
    psVar6[2] = 0.225;
    psVar6 = ppsVar8[3];
    *psVar6 = 0.22374368670764586;
    psVar6[1] = 0.22374368670764586;
    uVar13 = 0x52310dd6;
    uVar14 = 0xbfb28e88;
    goto LAB_00129a62;
  case ARKODE_ESDIRK32I5L2SA_5_2_3:
    pAVar4 = ARKodeButcherTable_Alloc(5,1);
    pAVar4->q = 3;
    pAVar4->p = 2;
    psVar3 = pAVar4->c;
    psVar3[1] = 0.45;
    psVar3[2] = 0.8;
    psVar3[3] = 1.0;
    psVar3[4] = 1.0;
    psVar3 = pAVar4->b;
    *psVar3 = 0.21322176213480562;
    psVar3[1] = 0.3260047980544875;
    psVar3[2] = 0.5373779946761313;
    psVar3[3] = -0.3016045548654244;
    psVar3[4] = 0.225;
    psVar6 = pAVar4->d;
    *psVar6 = 0.2272160877233341;
    psVar6[1] = 0.3255666195624788;
    psVar6[2] = 0.46861135758651284;
    psVar6[3] = -0.20520648979080866;
    psVar6[4] = 0.18381242491848293;
    ppsVar8 = pAVar4->A;
    psVar6 = ppsVar8[1];
    *psVar6 = 0.225;
    psVar6[1] = 0.225;
    psVar6 = ppsVar8[2];
    *psVar6 = 0.2638888888888889;
    psVar6[1] = 0.3111111111111111;
    psVar6[2] = 0.225;
    psVar6 = ppsVar8[3];
    *psVar6 = 0.2896701388888889;
    psVar6[1] = 0.3236111111111111;
    uVar13 = 0x33333333;
    uVar14 = 0x3fc4b333;
LAB_00129a62:
    *(undefined4 *)(psVar6 + 2) = uVar13;
    *(undefined4 *)((long)psVar6 + 0x14) = uVar14;
    *(undefined4 *)(psVar6 + 3) = 0xcccccccd;
    *(undefined4 *)((long)psVar6 + 0x1c) = 0x3fcccccc;
    psVar6 = ppsVar8[4];
    *psVar6 = *psVar3;
    psVar6[1] = psVar3[1];
    psVar6[2] = psVar3[2];
    psVar6[3] = psVar3[3];
    psVar6[4] = psVar3[4];
    break;
  case ARKODE_ESDIRK436L2SA_6_3_4:
    pAVar4 = ARKodeButcherTable_Alloc(6,1);
    pAVar4->q = 4;
    pAVar4->p = 3;
    psVar3 = pAVar4->c;
    psVar3[1] = 0.5;
    psVar3[2] = 0.1464466094067262;
    psVar3[3] = 0.625;
    psVar3[4] = 1.04;
    psVar3[5] = 1.0;
    psVar6 = pAVar4->b;
    *psVar6 = -0.015587635035716509;
    psVar6[1] = -0.015587635035716509;
    psVar6[2] = 0.3876576709132033;
    psVar6[3] = 0.5017726195721631;
    psVar6[4] = -0.10825502041393352;
    psVar6[5] = 0.25;
    psVar1 = pAVar4->d;
    *psVar1 = -0.09651334216818033;
    psVar1[1] = -0.09651334216818033;
    psVar1[2] = 0.5228199509962342;
    psVar1[3] = 0.5205678646221885;
    psVar1[4] = -0.08255805440762122;
    psVar1[5] = 0.23219692312555915;
    ppsVar8 = pAVar4->A;
    pdVar12 = ppsVar8[1];
    pdVar12[1] = 0.25;
    pdVar11 = ppsVar8[2];
    pdVar11[1] = -0.05177669529663689;
    pdVar11[2] = 0.25;
    pdVar10 = ppsVar8[3];
    pdVar10[1] = -0.07655460838455729;
    pdVar10[2] = 0.5281092167691145;
    pdVar10[3] = 0.25;
    pdVar7 = ppsVar8[4];
    pdVar7[1] = -0.7274063478261299;
    pdVar7[2] = 1.5849950617406794;
    uVar13 = 0xdedf2dc7;
    uVar14 = 0x3fe51d39;
    goto LAB_0012a47b;
  case ARKODE_ESDIRK43I6L2SA_6_3_4:
    pAVar4 = ARKodeButcherTable_Alloc(6,1);
    pAVar4->q = 4;
    pAVar4->p = 3;
    psVar3 = pAVar4->c;
    psVar3[1] = 0.5;
    psVar3[2] = 0.1464466094067262;
    psVar3[3] = 0.5803591573139935;
    psVar3[4] = 1.0;
    psVar3[5] = 1.0;
    psVar6 = pAVar4->b;
    *psVar6 = 0.06632461208191097;
    psVar6[1] = 0.06632461208191097;
    psVar6[2] = 0.22236269423069369;
    psVar6[3] = 0.5021309387483415;
    psVar6[4] = -0.10714285714285714;
    psVar6[5] = 0.25;
    psVar1 = pAVar4->d;
    *psVar1 = -0.018437906120613;
    psVar1[1] = -0.018437906120613;
    psVar1[2] = 0.3643795346432077;
    psVar1[3] = 0.5162497304522604;
    psVar1[4] = -0.06251150951414057;
    psVar1[5] = 0.2187580566598984;
    ppsVar8 = pAVar4->A;
    pdVar12 = ppsVar8[1];
    pdVar12[1] = 0.25;
    pdVar11 = ppsVar8[2];
    pdVar11[1] = -0.05177669529663688;
    pdVar11[2] = 0.25;
    pdVar10 = ppsVar8[3];
    pdVar10[1] = -0.12100710522809056;
    pdVar10[2] = 0.5723733677701747;
    pdVar10[3] = 0.25;
    pdVar7 = ppsVar8[4];
    pdVar7[1] = -0.6119504017336055;
    pdVar7[2] = 1.3587904035004925;
    uVar13 = 0x1692b4b;
    uVar14 = 0x3fe3aefc;
LAB_0012a47b:
    *(undefined4 *)(pdVar7 + 3) = uVar13;
    *(undefined4 *)((long)pdVar7 + 0x1c) = uVar14;
    *(undefined4 *)(pdVar7 + 4) = 0;
    *(undefined4 *)((long)pdVar7 + 0x24) = 0x3fd00000;
    psVar1 = ppsVar8[5];
    *psVar1 = *psVar6;
    psVar1[1] = psVar6[1];
    psVar1[2] = psVar6[2];
    psVar1[3] = psVar6[3];
    psVar1[4] = psVar6[4];
    psVar1[5] = psVar6[5];
    *pdVar12 = psVar3[1] - pdVar12[1];
    *pdVar11 = (psVar3[2] - pdVar11[1]) - pdVar11[2];
    *pdVar10 = ((psVar3[3] - pdVar10[1]) - pdVar10[2]) - pdVar10[3];
    dVar2 = (((psVar3[4] - pdVar7[1]) - pdVar7[2]) - pdVar7[3]) - pdVar7[4];
LAB_0012a517:
    *pdVar7 = dVar2;
    break;
  case ARKODE_QESDIRK436L2SA_6_3_4:
    pAVar4 = ARKodeButcherTable_Alloc(6,1);
    pAVar4->q = 4;
    pAVar4->p = 3;
    psVar3 = pAVar4->c;
    psVar3[1] = 0.21333333333333335;
    psVar3[2] = 0.18745166004060956;
    psVar3[3] = 0.5237349638615413;
    psVar3[4] = 1.0437682988410166;
    psVar3[5] = 1.0;
    psVar3 = pAVar4->b;
    *psVar3 = 0.11507824627133408;
    psVar3[2] = 0.13891173144118288;
    psVar3[3] = 0.5589929940192544;
    psVar3[4] = -0.1329829717317714;
    psVar3[5] = 0.32;
    psVar6 = pAVar4->d;
    *psVar6 = -0.04435710074704296;
    psVar6[1] = -1.5839347397183428;
    psVar6[2] = 1.8584346081654304;
    psVar6[3] = 0.5780406793432736;
    psVar6[4] = -0.11463186751229457;
    psVar6[5] = 0.3064484204689764;
    ppsVar8 = pAVar4->A;
    psVar6 = ppsVar8[1];
    *psVar6 = 0.10666666666666667;
    psVar6[1] = 0.10666666666666667;
    psVar6 = ppsVar8[2];
    *psVar6 = 0.06627416997969521;
    psVar6[1] = -0.19882250993908562;
    psVar6[2] = 0.32;
    psVar6 = ppsVar8[3];
    *psVar6 = -0.4886087369119395;
    psVar6[1] = -6.190751520067358;
    psVar6[2] = 6.883095220840839;
    psVar6[3] = 0.32;
    psVar6 = ppsVar8[4];
    *psVar6 = -3.1283269307169475;
    psVar6[1] = -32.206585572984054;
    psVar6[2] = 35.100563192176956;
    psVar6[3] = 0.9581176103650633;
    psVar6[4] = 0.32;
    psVar6 = ppsVar8[5];
    *psVar6 = *psVar3;
    psVar6[1] = psVar3[1];
    psVar6[2] = psVar3[2];
    psVar6[3] = psVar3[3];
    psVar6[4] = psVar3[4];
    psVar6[5] = psVar3[5];
    break;
  case ARKODE_ESDIRK437L2SA_7_3_4:
    pAVar4 = ARKodeButcherTable_Alloc(7,1);
    pAVar4->q = 4;
    pAVar4->p = 3;
    psVar3 = pAVar4->c;
    psVar3[1] = 0.25;
    psVar3[2] = 0.07322330470336312;
    psVar3[3] = 0.5;
    psVar3[4] = 0.6966490299823633;
    psVar3[5] = 0.7063492063492064;
    psVar3[6] = 1.0;
    psVar6 = pAVar4->b;
    psVar6[2] = 0.9391524145239087;
    psVar6[3] = 0.5185422838949312;
    psVar6[4] = 0.7755100321672022;
    psVar6[5] = -0.5565015005668256;
    psVar6[6] = 0.125;
    *psVar6 = -0.4008516150096083;
    psVar6[1] = -0.40085161500960825;
    psVar1 = pAVar4->d;
    psVar1[2] = 0.6587096818817366;
    psVar1[3] = 0.500477735724069;
    psVar1[4] = 0.7607872310157867;
    psVar1[5] = -0.5714751468025063;
    psVar1[6] = 0.1357142857142857;
    *psVar1 = -0.24210689376668573;
    psVar1[1] = -0.24210689376668584;
    ppsVar8 = pAVar4->A;
    pdVar12 = ppsVar8[1];
    pdVar12[1] = 0.125;
    pdVar11 = ppsVar8[2];
    pdVar11[1] = -0.02588834764831844;
    pdVar11[2] = 0.125;
    pdVar10 = ppsVar8[3];
    pdVar10[1] = 0.33838834764831843;
    pdVar10[2] = -0.30177669529663687;
    pdVar10[3] = 0.125;
    pdVar9 = ppsVar8[4];
    pdVar9[1] = -0.3592453618381594;
    pdVar9[2] = 0.9365078600463644;
    pdVar9[3] = 0.3536318936123176;
    pdVar9[4] = 0.125;
    pdVar7 = ppsVar8[5];
    pdVar7[1] = 0.23361061091244562;
    pdVar7[2] = -0.0433153738101898;
    pdVar7[3] = 0.01903274535895701;
    pdVar7[4] = 0.13841061297554788;
    pdVar7[5] = 0.125;
    psVar1 = ppsVar8[6];
    *psVar1 = *psVar6;
    psVar1[1] = psVar6[1];
    psVar1[2] = psVar6[2];
    psVar1[3] = psVar6[3];
    psVar1[4] = psVar6[4];
    psVar1[5] = psVar6[5];
    psVar1[6] = psVar6[6];
    *pdVar12 = psVar3[1] - pdVar12[1];
    goto LAB_0012a0fa;
  case ARKODE_ESDIRK547L2SA_7_4_5:
    pAVar4 = ARKodeButcherTable_Alloc(7,1);
    pAVar4->q = 5;
    pAVar4->p = 4;
    psVar3 = pAVar4->c;
    psVar3[1] = 0.368;
    psVar3[2] = 0.10778470452335051;
    psVar3[3] = 0.52;
    psVar3[4] = 0.6531582768582439;
    psVar3[5] = 1.04;
    psVar3[6] = 1.0;
    psVar6 = pAVar4->b;
    psVar6[2] = 0.42427748359919076;
    psVar6[3] = 0.27546898147535387;
    psVar6[4] = 0.3205107788979717;
    psVar6[5] = -0.05226101488479355;
    psVar6[6] = 0.184;
    *psVar6 = -0.07599811454386142;
    psVar6[1] = -0.07599811454386138;
    psVar1 = pAVar4->d;
    psVar1[2] = 0.4837275788865379;
    psVar1[3] = 0.23595105756244605;
    psVar1[4] = 0.3753833643342551;
    psVar1[5] = -0.03230666251372478;
    psVar1[6] = 0.15334335263909166;
    *psVar1 = -0.10804934545430289;
    psVar1[1] = -0.10804934545430295;
    ppsVar8 = pAVar4->A;
    pdVar12 = ppsVar8[1];
    pdVar12[1] = 0.184;
    pdVar11 = ppsVar8[2];
    pdVar11[1] = -0.03810764773832474;
    pdVar11[2] = 0.184;
    pdVar10 = ppsVar8[3];
    pdVar10[1] = 0.0216776649587785;
    pdVar10[2] = 0.292644670082443;
    pdVar10[3] = 0.184;
    pdVar9 = ppsVar8[4];
    pdVar9[1] = -0.8510462661735156;
    pdVar9[2] = 1.753303815732698;
    pdVar9[3] = 0.41794699347257747;
    pdVar9[4] = 0.184;
    pdVar7 = ppsVar8[5];
    pdVar7[1] = -5.03561612174922;
    pdVar7[2] = 8.971305293795128;
    pdVar7[3] = 0.31505839963851934;
    pdVar7[4] = 1.6408685500647917;
    pdVar7[5] = 0.184;
    psVar1 = ppsVar8[6];
    *psVar1 = *psVar6;
    psVar1[1] = psVar6[1];
    psVar1[2] = psVar6[2];
    psVar1[3] = psVar6[3];
    psVar1[4] = psVar6[4];
    psVar1[5] = psVar6[5];
    psVar1[6] = psVar6[6];
    *pdVar12 = psVar3[1] - pdVar12[1];
    psVar3 = pAVar4->c;
LAB_0012a0fa:
    *pdVar11 = (psVar3[2] - pdVar11[1]) - pdVar11[2];
    *pdVar10 = ((psVar3[3] - pdVar10[1]) - pdVar10[2]) - pdVar10[3];
    *pdVar9 = (((psVar3[4] - pdVar9[1]) - pdVar9[2]) - pdVar9[3]) - pdVar9[4];
    dVar2 = ((((psVar3[5] - pdVar7[1]) - pdVar7[2]) - pdVar7[3]) - pdVar7[4]) - pdVar7[5];
    goto LAB_0012a517;
  case ARKODE_ESDIRK547L2SA2_7_4_5:
    pAVar4 = ARKodeButcherTable_Alloc(7,1);
    pAVar4->q = 5;
    pAVar4->p = 4;
    psVar3 = pAVar4->c;
    psVar3[1] = 0.368;
    psVar3[2] = 0.6282152954766494;
    psVar3[3] = 0.1388101983002833;
    psVar3[4] = 0.6999586194045747;
    psVar3[5] = 0.9083769633507853;
    psVar3[6] = 1.0;
    psVar3 = pAVar4->b;
    psVar3[2] = 0.27263649025024267;
    psVar3[3] = 0.4321651725202882;
    psVar3[4] = 0.3524160862328891;
    psVar3[5] = -0.16228561078393952;
    psVar3[6] = 0.184;
    *psVar3 = -0.03946606910974035;
    psVar3[1] = -0.03946606910974026;
    psVar6 = pAVar4->d;
    psVar6[2] = 0.18289968461343553;
    psVar6[3] = 0.517013873766231;
    psVar6[4] = 0.4265997313024543;
    psVar6[5] = -0.10432685796713498;
    psVar6[6] = 0.13919250141830897;
    *psVar6 = -0.08068946656664727;
    psVar6[1] = -0.08068946656664744;
    ppsVar8 = pAVar4->A;
    pdVar12 = ppsVar8[1];
    pdVar12[1] = 0.184;
    pdVar11 = ppsVar8[2];
    pdVar11[1] = 0.22210764773832475;
    pdVar11[2] = 0.184;
    pdVar10 = ppsVar8[3];
    pdVar10[1] = -0.014049475381926283;
    pdVar10[2] = -0.01709085093586415;
    pdVar10[3] = 0.184;
    pdVar9 = ppsVar8[4];
    pdVar9[1] = -0.40838859254931464;
    pdVar9[2] = 0.16646399821362964;
    pdVar9[3] = 1.1662718062895745;
    pdVar9[4] = 0.184;
    pdVar7 = ppsVar8[5];
    pdVar7[1] = -0.5392907235588114;
    pdVar7[2] = -0.242234428845425;
    pdVar7[3] = 1.4888806111225146;
    pdVar7[4] = 0.5563122281913184;
    pdVar7[5] = 0.184;
    psVar6 = ppsVar8[6];
    *psVar6 = *psVar3;
    psVar6[1] = psVar3[1];
    psVar6[2] = psVar3[2];
    psVar6[3] = psVar3[3];
    psVar6[4] = psVar3[4];
    psVar6[5] = psVar3[5];
    psVar6[6] = psVar3[6];
    psVar3 = pAVar4->c;
    *pdVar12 = psVar3[1] - pdVar12[1];
    *pdVar11 = (psVar3[2] - pdVar11[1]) - pdVar11[2];
    *pdVar10 = ((psVar3[3] - pdVar10[1]) - pdVar10[2]) - pdVar10[3];
    *pdVar9 = (((psVar3[4] - pdVar9[1]) - pdVar9[2]) - pdVar9[3]) - pdVar9[4];
    *pdVar7 = ((((psVar3[5] - pdVar7[1]) - pdVar7[2]) - pdVar7[3]) - pdVar7[4]) - pdVar7[5];
    break;
  case ARKODE_ARK2_DIRK_3_1_2:
    pAVar4 = ARKodeButcherTable_Alloc(3,1);
    pAVar4->q = 2;
    pAVar4->p = 1;
    ppsVar8 = pAVar4->A;
    psVar3 = ppsVar8[1];
    *psVar3 = 0.29289321881345254;
    psVar3[1] = 0.29289321881345254;
    psVar3 = ppsVar8[2];
    *psVar3 = 0.35355339059327373;
    psVar3[1] = 0.35355339059327373;
    psVar3[2] = 0.29289321881345254;
    psVar3 = pAVar4->b;
    *psVar3 = 0.35355339059327373;
    psVar3[1] = 0.35355339059327373;
    psVar3[2] = 0.29289321881345254;
    psVar3 = pAVar4->d;
    *psVar3 = 0.32322330470336313;
    psVar3[1] = 0.32322330470336313;
    sVar5 = 0.35355339059327373;
LAB_0012aa76:
    psVar3[2] = sVar5;
    psVar3 = pAVar4->c;
    psVar3[1] = 0.5857864376269049;
    psVar3[2] = 1.0;
    break;
  case ARKODE_BACKWARD_EULER_1_1:
    pAVar4 = ARKodeButcherTable_Alloc(1,0);
    pAVar4->q = 1;
    pAVar4->p = 0;
    sVar5 = 1.0;
    **pAVar4->A = 1.0;
    *pAVar4->b = 1.0;
    goto LAB_00129929;
  case ARKODE_IMPLICIT_MIDPOINT_1_2:
    pAVar4 = ARKodeButcherTable_Alloc(1,0);
    pAVar4->q = 2;
    pAVar4->p = 0;
    sVar5 = 0.5;
    **pAVar4->A = 0.5;
    *pAVar4->b = 1.0;
LAB_00129929:
    *pAVar4->c = sVar5;
    break;
  case ARKODE_IMPLICIT_TRAPEZOIDAL_2_2:
    pAVar4 = ARKodeButcherTable_Alloc(2,0);
    pAVar4->q = 2;
    pAVar4->p = 0;
    psVar3 = pAVar4->A[1];
    *psVar3 = 0.5;
    psVar3[1] = 0.5;
    psVar3 = pAVar4->b;
    *psVar3 = 0.5;
    psVar3[1] = 0.5;
    pAVar4->c[1] = 1.0;
    break;
  default:
    if (imethod == ARKODE_DIRK_NONE) {
      pAVar4 = (ARKodeButcherTable)0x0;
    }
    else {
      pAVar4 = (ARKodeButcherTable)0x0;
      arkProcessError((ARKodeMem)0x0,-0x16,0x29,"ARKodeButcherTable_LoadDIRK",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_butcher_dirk.c"
                      ,"Unknown Butcher table");
    }
  }
  return pAVar4;
}

Assistant:

ARKodeButcherTable ARKodeButcherTable_LoadDIRK(ARKODE_DIRKTableID imethod)
{
  /* Use X-macro to test each method name */
  switch (imethod)
  {
#define ARK_BUTCHER_TABLE(name, coeff) \
  case name: coeff break;
#include "arkode_butcher_dirk.def"
#undef ARK_BUTCHER_TABLE

  default:
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Unknown Butcher table");
    return NULL;
  }
}